

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_474c66::ArchToolsetStrategyHelper
          (optional<cmCMakePresetsGraph::ArchToolsetStrategy> *out,Value *value)

{
  bool bVar1;
  ArchToolsetStrategy local_8c;
  ValueHolder local_88;
  String local_80;
  ArchToolsetStrategy local_60;
  ValueHolder local_5c [2];
  String local_48;
  Value *local_20;
  Value *value_local;
  optional<cmCMakePresetsGraph::ArchToolsetStrategy> *out_local;
  
  local_20 = value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>::operator=(out);
    out_local._4_4_ = READ_OK;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_48,local_20);
      bVar1 = std::operator==(&local_48,"set");
      std::__cxx11::string::~string((string *)&local_48);
      if (bVar1) {
        local_60 = Set;
        std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>::
        optional<cmCMakePresetsGraph::ArchToolsetStrategy,_true>
                  ((optional<cmCMakePresetsGraph::ArchToolsetStrategy> *)local_5c,&local_60);
        value_local->value_ = local_5c[0];
        out_local._4_4_ = READ_OK;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_80,local_20);
        bVar1 = std::operator==(&local_80,"external");
        std::__cxx11::string::~string((string *)&local_80);
        if (bVar1) {
          local_8c = External;
          std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>::
          optional<cmCMakePresetsGraph::ArchToolsetStrategy,_true>
                    ((optional<cmCMakePresetsGraph::ArchToolsetStrategy> *)&local_88,&local_8c);
          value_local->value_ = local_88;
          out_local._4_4_ = READ_OK;
        }
        else {
          out_local._4_4_ = INVALID_PRESET;
        }
      }
    }
    else {
      out_local._4_4_ = INVALID_PRESET;
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult ArchToolsetStrategyHelper(
  cm::optional<ArchToolsetStrategy>& out, const Json::Value* value)
{
  if (!value) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "set") {
    out = ArchToolsetStrategy::Set;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "external") {
    out = ArchToolsetStrategy::External;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}